

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppLayout(bool *p_open)

{
  bool bVar1;
  float fVar2;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  char local_a8 [8];
  char label [128];
  int i;
  ImVec2 local_18;
  bool *local_10;
  bool *p_open_local;
  
  local_10 = p_open;
  ImVec2::ImVec2(&local_18,500.0,440.0);
  ImGui::SetNextWindowSize(&local_18,4);
  bVar1 = ImGui::Begin("Example: Layout",local_10,0x400);
  if (bVar1) {
    bVar1 = ImGui::BeginMenuBar();
    if (bVar1) {
      bVar1 = ImGui::BeginMenu("File",true);
      if (bVar1) {
        bVar1 = ImGui::MenuItem("Close",(char *)0x0,false,true);
        if (bVar1) {
          *local_10 = false;
        }
        ImGui::EndMenu();
      }
      ImGui::EndMenuBar();
    }
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0,150.0,0.0);
    ImGui::BeginChild("left pane",(ImVec2 *)&stack0xffffffffffffffe0,true,0);
    label[0x7c] = '\0';
    label[0x7d] = '\0';
    label[0x7e] = '\0';
    label[0x7f] = '\0';
    for (; (int)label._124_4_ < 100; label._124_4_ = label._124_4_ + 1) {
      sprintf(local_a8,"MyObject %d",(ulong)(uint)label._124_4_);
      bVar1 = ShowExampleAppLayout::selected == label._124_4_;
      ImVec2::ImVec2(&local_b0,0.0,0.0);
      bVar1 = ImGui::Selectable(local_a8,bVar1,0,&local_b0);
      if (bVar1) {
        ShowExampleAppLayout::selected._0_1_ = label[0x7c];
        ShowExampleAppLayout::selected._1_1_ = label[0x7d];
        ShowExampleAppLayout::selected._2_1_ = label[0x7e];
        ShowExampleAppLayout::selected._3_1_ = label[0x7f];
      }
    }
    ImGui::EndChild();
    ImGui::SameLine(0.0,-1.0);
    ImGui::BeginGroup();
    fVar2 = ImGui::GetFrameHeightWithSpacing();
    ImVec2::ImVec2(&local_b8,0.0,-fVar2);
    ImGui::BeginChild("item view",&local_b8,false,0);
    ImGui::Text("MyObject: %d",(ulong)(uint)ShowExampleAppLayout::selected);
    ImGui::Separator();
    ImGui::TextWrapped(
                      "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. "
                      );
    ImGui::EndChild();
    ImVec2::ImVec2(&local_c0,0.0,0.0);
    ImGui::Button("Revert",&local_c0);
    ImGui::SameLine(0.0,-1.0);
    ImVec2::ImVec2(&local_c8,0.0,0.0);
    ImGui::Button("Save",&local_c8);
    ImGui::EndGroup();
  }
  ImGui::End();
  return;
}

Assistant:

static void ShowExampleAppLayout(bool* p_open)
{
    ImGui::SetNextWindowSize(ImVec2(500, 440), ImGuiCond_FirstUseEver);
    if (ImGui::Begin("Example: Layout", p_open, ImGuiWindowFlags_MenuBar))
    {
        if (ImGui::BeginMenuBar())
        {
            if (ImGui::BeginMenu("File"))
            {
                if (ImGui::MenuItem("Close")) *p_open = false;
                ImGui::EndMenu();
            }
            ImGui::EndMenuBar();
        }

        // left
        static int selected = 0;
        ImGui::BeginChild("left pane", ImVec2(150, 0), true);
        for (int i = 0; i < 100; i++)
        {
            char label[128];
            sprintf(label, "MyObject %d", i);
            if (ImGui::Selectable(label, selected == i))
                selected = i;
        }
        ImGui::EndChild();
        ImGui::SameLine();

        // right
        ImGui::BeginGroup();
            ImGui::BeginChild("item view", ImVec2(0, -ImGui::GetFrameHeightWithSpacing())); // Leave room for 1 line below us
                ImGui::Text("MyObject: %d", selected);
                ImGui::Separator();
                ImGui::TextWrapped("Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. ");
            ImGui::EndChild();
            if (ImGui::Button("Revert")) {}
            ImGui::SameLine();
            if (ImGui::Button("Save")) {}
        ImGui::EndGroup();
    }
    ImGui::End();
}